

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O0

DrawResult * __thiscall
vkt::tessellation::anon_unknown_0::InvariantOuterEdge::BaseTestInstance::draw
          (DrawResult *__return_storage_ptr__,BaseTestInstance *this,deUint32 vertexCount,
          vector<float,_std::allocator<float>_> *patchTessLevels,Winding winding,bool usePointMode)

{
  TessPrimitiveType primitiveType;
  SpacingMode spacingMode;
  VkPipelineLayout pipelineLayout;
  VkCommandBuffer commandBuffer;
  VkRenderPass renderPass;
  VkCommandBuffer_s *pVVar1;
  deUint64 dVar2;
  RefData<vk::Handle<(vk::HandleType)18>_> data;
  VkAllocationCallbacks *queue_00;
  int iVar3;
  DeviceInterface *vk_00;
  VkDevice device_00;
  GraphicsPipelineBuilder *pGVar4;
  ProgramCollection<vk::ProgramBinary> *pPVar5;
  ProgramBinary *pPVar6;
  Handle<(vk::HandleType)16> *pHVar7;
  Handle<(vk::HandleType)17> *pHVar8;
  Allocation *this_00;
  void *pvVar9;
  VkDeviceMemory memory;
  VkDeviceSize VVar10;
  VkCommandBuffer_s **ppVVar11;
  Handle<(vk::HandleType)23> *pHVar12;
  Handle<(vk::HandleType)18> *pHVar13;
  Handle<(vk::HandleType)22> *pHVar14;
  VkBuffer *pVVar15;
  const_reference levels;
  deInt32 *pdVar16;
  TestContext *this_01;
  TestLog *log_00;
  _func_bool_PerPrimitive_ptr_PerPrimitive_ptr *pred;
  TestLog *log;
  vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  local_358;
  undefined1 local_339;
  VkDeviceMemory local_338;
  Allocation *local_330;
  Allocation *resultAlloc;
  undefined1 local_320 [8];
  VkBufferMemoryBarrier shaderWriteBarrier;
  VkDeviceSize vertexBufferOffset;
  Allocation *alloc;
  allocator<char> local_299;
  string local_298;
  string local_278;
  allocator<char> local_251;
  string local_250;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  GraphicsPipelineBuilder local_1b0;
  Move<vk::Handle<(vk::HandleType)18>_> local_a8;
  RefData<vk::Handle<(vk::HandleType)18>_> local_88;
  undefined1 local_68 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  bool usePointMode_local;
  Winding winding_local;
  vector<float,_std::allocator<float>_> *patchTessLevels_local;
  deUint32 vertexCount_local;
  BaseTestInstance *this_local;
  DrawResult *result;
  
  vk_00 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device_00 = Context::getDevice((this->super_TestInstance).m_context);
  pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)Context::getUniversalQueue((this->super_TestInstance).m_context);
  GraphicsPipelineBuilder::GraphicsPipelineBuilder(&local_1b0);
  pGVar4 = GraphicsPipelineBuilder::setPatchControlPoints(&local_1b0,6);
  pGVar4 = GraphicsPipelineBuilder::setVertexInputSingleAttribute
                     (pGVar4,this->m_vertexFormat,this->m_vertexStride);
  pPVar5 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"vert",&local_1e1);
  pPVar6 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar5,&local_1e0);
  pGVar4 = GraphicsPipelineBuilder::setShader
                     (pGVar4,vk_00,device_00,VK_SHADER_STAGE_VERTEX_BIT,pPVar6,
                      (VkSpecializationInfo *)0x0);
  pPVar5 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"tesc",&local_209);
  pPVar6 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar5,&local_208);
  pGVar4 = GraphicsPipelineBuilder::setShader
                     (pGVar4,vk_00,device_00,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,pPVar6,
                      (VkSpecializationInfo *)0x0);
  pPVar5 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"tese",&local_251);
  getProgramName(&local_230,&local_250,winding,usePointMode);
  pPVar6 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar5,&local_230);
  pGVar4 = GraphicsPipelineBuilder::setShader
                     (pGVar4,vk_00,device_00,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,pPVar6,
                      (VkSpecializationInfo *)0x0);
  pPVar5 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"geom",&local_299);
  getProgramName(&local_278,&local_298,usePointMode);
  pPVar6 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar5,&local_278);
  pGVar4 = GraphicsPipelineBuilder::setShader
                     (pGVar4,vk_00,device_00,VK_SHADER_STAGE_GEOMETRY_BIT,pPVar6,
                      (VkSpecializationInfo *)0x0);
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                     (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  pipelineLayout.m_internal = pHVar7->m_internal;
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  GraphicsPipelineBuilder::build
            (&local_a8,pGVar4,vk_00,device_00,pipelineLayout,(VkRenderPass)pHVar8->m_internal);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_88,(Move *)&local_a8);
  data.deleter.m_deviceIface._0_4_ = (int)local_88.deleter.m_deviceIface;
  data.object.m_internal = local_88.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_88.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device = local_88.deleter.m_device;
  data.deleter.m_allocator._0_4_ = (int)local_88.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_88.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_68,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_a8);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder(&local_1b0);
  this_00 = tessellation::Buffer::getAllocation(&this->m_resultBuffer);
  pvVar9 = ::vk::Allocation::getHostPtr(this_00);
  ::deMemset(pvVar9,0,this->m_resultBufferSizeBytes);
  memory = ::vk::Allocation::getMemory(this_00);
  VVar10 = ::vk::Allocation::getOffset(this_00);
  ::vk::flushMappedMemoryRange(vk_00,device_00,memory,VVar10,this->m_resultBufferSizeBytes);
  ppVVar11 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  beginCommandBuffer(vk_00,*ppVVar11);
  ppVVar11 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  commandBuffer = *ppVVar11;
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  renderPass.m_internal = pHVar8->m_internal;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                      (&(this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>);
  beginRenderPassWithRasterizationDisabled
            (vk_00,commandBuffer,renderPass,(VkFramebuffer)pHVar12->m_internal);
  ppVVar11 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar1 = *ppVVar11;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_68);
  (*vk_00->_vptr_DeviceInterface[0x4c])(vk_00,pVVar1,0,pHVar13->m_internal);
  ppVVar11 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar1 = *ppVVar11;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                     (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  dVar2 = pHVar7->m_internal;
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::get
                      (&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>);
  (*vk_00->_vptr_DeviceInterface[0x56])(vk_00,pVVar1,0,dVar2,0,1,pHVar14,0,0);
  shaderWriteBarrier.size = 0;
  ppVVar11 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar1 = *ppVVar11;
  pVVar15 = tessellation::Buffer::get(&this->m_vertexBuffer);
  (*vk_00->_vptr_DeviceInterface[0x58])(vk_00,pVVar1,0,1,pVVar15,&shaderWriteBarrier.size);
  ppVVar11 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (*vk_00->_vptr_DeviceInterface[0x59])(vk_00,*ppVVar11,(ulong)vertexCount,1,0);
  ppVVar11 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  endRenderPass(vk_00,*ppVVar11);
  pVVar15 = tessellation::Buffer::operator*(&this->m_resultBuffer);
  resultAlloc = (Allocation *)pVVar15->m_internal;
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)local_320,0x40,0x2000,(VkBuffer)resultAlloc,0,
             this->m_resultBufferSizeBytes);
  ppVVar11 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar11,0x8000,0x4000,0,0,0,1,local_320,0,0);
  ppVVar11 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  endCommandBuffer(vk_00,*ppVVar11);
  queue_00 = pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  ppVVar11 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  submitCommandsAndWait(vk_00,device_00,(VkQueue)queue_00,*ppVVar11);
  local_330 = tessellation::Buffer::getAllocation(&this->m_resultBuffer);
  local_338 = ::vk::Allocation::getMemory(local_330);
  VVar10 = ::vk::Allocation::getOffset(local_330);
  ::vk::invalidateMappedMemoryRange(vk_00,device_00,local_338,VVar10,this->m_resultBufferSizeBytes);
  local_339 = 0;
  DrawResult::DrawResult(__return_storage_ptr__);
  __return_storage_ptr__->success = true;
  primitiveType = (this->m_caseDef).primitiveType;
  spacingMode = (this->m_caseDef).spacingMode;
  levels = std::vector<float,_std::allocator<float>_>::operator[](patchTessLevels,0);
  iVar3 = multiplePatchReferencePrimitiveCount
                    (primitiveType,spacingMode,usePointMode,levels,this->m_numPatchesToDraw);
  __return_storage_ptr__->refNumPrimitives = iVar3;
  iVar3 = numVerticesPerPrimitive((this->m_caseDef).primitiveType,usePointMode);
  __return_storage_ptr__->numPrimitiveVertices = iVar3;
  pdVar16 = (deInt32 *)::vk::Allocation::getHostPtr(local_330);
  __return_storage_ptr__->numPrimitives = *pdVar16;
  iVar3 = __return_storage_ptr__->numPrimitives;
  pvVar9 = ::vk::Allocation::getHostPtr(local_330);
  pred = (_func_bool_PerPrimitive_ptr_PerPrimitive_ptr *)
         (ulong)(uint)this->m_resultBufferPrimitiveDataOffset;
  readInterleavedData<vkt::tessellation::(anonymous_namespace)::PerPrimitive>
            ((vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
              *)&log,iVar3,pvVar9,this->m_resultBufferPrimitiveDataOffset,0x40);
  sorted<vkt::tessellation::(anonymous_namespace)::PerPrimitive,bool(*)(vkt::tessellation::(anonymous_namespace)::PerPrimitive_const&,vkt::tessellation::(anonymous_namespace)::PerPrimitive_const&)>
            (&local_358,(tessellation *)&log,
             (vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
              *)byPatchPrimitiveID,pred);
  std::
  vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  ::operator=(&__return_storage_ptr__->primitives,&local_358);
  std::
  vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  ::~vector(&local_358);
  std::
  vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  ::~vector((vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
             *)&log);
  this_01 = Context::getTestContext((this->super_TestInstance).m_context);
  log_00 = tcu::TestContext::getLog(this_01);
  if (__return_storage_ptr__->numPrimitives != __return_storage_ptr__->refNumPrimitives) {
    logPrimitiveCountError
              (log_00,this->m_numPatchesToDraw,__return_storage_ptr__->numPrimitives,
               __return_storage_ptr__->refNumPrimitives,patchTessLevels);
    __return_storage_ptr__->success = false;
  }
  local_339 = 1;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_68);
  return __return_storage_ptr__;
}

Assistant:

BaseTestInstance::DrawResult BaseTestInstance::draw (const deUint32 vertexCount, const std::vector<float>& patchTessLevels, const Winding winding, const bool usePointMode)
{
	const DeviceInterface&	vk		= m_context.getDeviceInterface();
	const VkDevice			device	= m_context.getDevice();
	const VkQueue			queue	= m_context.getUniversalQueue();

	const Unique<VkPipeline> pipeline(GraphicsPipelineBuilder()
		.setPatchControlPoints        (NUM_TESS_LEVELS)
		.setVertexInputSingleAttribute(m_vertexFormat, m_vertexStride)
		.setShader                    (vk, device, VK_SHADER_STAGE_VERTEX_BIT,					m_context.getBinaryCollection().get("vert"), DE_NULL)
		.setShader                    (vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	m_context.getBinaryCollection().get("tesc"), DE_NULL)
		.setShader                    (vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, m_context.getBinaryCollection().get(getProgramName("tese", winding, usePointMode)), DE_NULL)
		.setShader                    (vk, device, VK_SHADER_STAGE_GEOMETRY_BIT,                m_context.getBinaryCollection().get(getProgramName("geom", usePointMode)), DE_NULL)
		.build                        (vk, device, *m_pipelineLayout, *m_renderPass));

	{
		const Allocation& alloc = m_resultBuffer.getAllocation();
		deMemset(alloc.getHostPtr(), 0, static_cast<std::size_t>(m_resultBufferSizeBytes));
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), m_resultBufferSizeBytes);
	}

	beginCommandBuffer(vk, *m_cmdBuffer);
	beginRenderPassWithRasterizationDisabled(vk, *m_cmdBuffer, *m_renderPass, *m_framebuffer);

	vk.cmdBindPipeline(*m_cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
	vk.cmdBindDescriptorSets(*m_cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipelineLayout, 0u, 1u, &m_descriptorSet.get(), 0u, DE_NULL);
	{
		const VkDeviceSize vertexBufferOffset = 0ull;
		vk.cmdBindVertexBuffers(*m_cmdBuffer, 0u, 1u, &m_vertexBuffer.get(), &vertexBufferOffset);
	}

	vk.cmdDraw(*m_cmdBuffer, vertexCount, 1u, 0u, 0u);
	endRenderPass(vk, *m_cmdBuffer);

	{
		const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(
			VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *m_resultBuffer, 0ull, m_resultBufferSizeBytes);

		vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, 1u, &shaderWriteBarrier, 0u, DE_NULL);
	}

	endCommandBuffer(vk, *m_cmdBuffer);
	submitCommandsAndWait(vk, device, queue, *m_cmdBuffer);

	// Read back and check results

	const Allocation& resultAlloc = m_resultBuffer.getAllocation();
	invalidateMappedMemoryRange(vk, device, resultAlloc.getMemory(), resultAlloc.getOffset(), m_resultBufferSizeBytes);

	DrawResult result;
	result.success				= true;
	result.refNumPrimitives     = multiplePatchReferencePrimitiveCount(m_caseDef.primitiveType, m_caseDef.spacingMode, usePointMode, &patchTessLevels[0], m_numPatchesToDraw);
	result.numPrimitiveVertices = numVerticesPerPrimitive(m_caseDef.primitiveType, usePointMode);
	result.numPrimitives        = *static_cast<deInt32*>(resultAlloc.getHostPtr());
	result.primitives           = sorted(readInterleavedData<PerPrimitive>(result.numPrimitives, resultAlloc.getHostPtr(), m_resultBufferPrimitiveDataOffset, sizeof(PerPrimitive)),
										 byPatchPrimitiveID);

	// If this fails then we didn't read all vertices from shader and test must be changed to allow more.
	DE_ASSERT(result.numPrimitives <= m_maxNumPrimitivesInDrawCall);

	tcu::TestLog& log = m_context.getTestContext().getLog();
	if (result.numPrimitives != result.refNumPrimitives)
	{
		logPrimitiveCountError(log, m_numPatchesToDraw, result.numPrimitives, result.refNumPrimitives, patchTessLevels);
		result.success = false;
	}
	return result;
}